

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O2

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::copy_from(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *this,flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *other)

{
  memory_resource *pmVar1;
  pointer_type pcVar2;
  sizes_t other_sizes;
  
  clear(this);
  if ((other->buffer_).v2_.last != (pointer_type)0x0) {
    get_all_sizes(&other_sizes,other);
    pmVar1 = (this->buffer_).v1_._M_resource;
    pcVar2 = (pointer_type)
             (**(code **)(*(long *)pmVar1 + 0x10))
                       (pmVar1,other_sizes.last_element.super_range.data_end,1);
    (this->buffer_).v2_.begin = pcVar2;
    memcpy(pcVar2,(other->buffer_).v2_.begin,other_sizes.last_element.super_range.data_end);
    pcVar2 = (this->buffer_).v2_.begin;
    (this->buffer_).v2_.end = pcVar2 + other_sizes.last_element.super_range.data_end;
    (this->buffer_).v2_.last = pcVar2 + other_sizes.last_element.super_range.buffer_begin;
  }
  return;
}

Assistant:

void copy_from(flat_forward_list const &other) {
        clear();
        if (other.buff().last) {
            sizes_t const other_sizes{ other.get_all_sizes() };
            buff().begin = allocate_buffer(other_sizes.used_capacity().size);
            copy_data(buff().begin, other.buff().begin, other_sizes.used_capacity().size);
            buff().end = buff().begin + other_sizes.used_capacity().size;
            buff().last = buff().begin + other_sizes.last_element.begin();
        }
    }